

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O1

bool template_image::_AssignmentOperator<float>(void)

{
  uint8_t alignment_;
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  EVP_PKEY_CTX *src;
  uint uVar6;
  uint8_t colorCount_;
  bool bVar7;
  ImageTemplate<float> image;
  ImageTemplate<float> image_copy;
  ImageTemplate<float> local_80;
  ImageTemplate<float> local_58;
  
  uVar1 = Test_Helper::runCount();
  bVar7 = uVar1 == 0;
  if (!bVar7) {
    uVar6 = 0;
    do {
      uVar2 = rand();
      uVar3 = rand();
      uVar4 = rand();
      colorCount_ = (uint8_t)(uVar4 & 3);
      if ((uVar4 & 3) == 0) {
        colorCount_ = '\x01';
      }
      uVar4 = rand();
      alignment_ = (uint8_t)(uVar4 & 0x1f);
      if ((uVar4 & 0x1f) == 0) {
        alignment_ = '\x01';
      }
      PenguinV_Image::ImageTemplate<float>::ImageTemplate
                (&local_80,uVar2 & 0x3ff,uVar3 & 0x3ff,colorCount_,alignment_);
      uVar2 = rand();
      PenguinV_Image::ImageTemplate<float>::fill(&local_80,(float)(uVar2 & 0xff));
      PenguinV_Image::ImageTemplate<float>::ImageTemplate(&local_58,0,0,'\x01','\x01');
      PenguinV_Image::ImageTemplate<float>::copy(&local_58,(EVP_PKEY_CTX *)&local_80,src);
      if ((((local_80._height != local_58._height) || (local_80._width != local_58._width)) ||
          (local_80._alignment != local_58._alignment)) ||
         (((local_80._colorCount != local_58._colorCount || (local_80._rowSize != local_58._rowSize)
           ) || (iVar5 = bcmp(local_80._data,local_58._data,
                              (ulong)local_80._height * (ulong)local_80._rowSize * 4), iVar5 != 0)))
         ) {
        local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219d28;
        PenguinV_Image::ImageTemplate<float>::clear(&local_58);
        local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219d28;
        PenguinV_Image::ImageTemplate<float>::clear(&local_80);
        return bVar7;
      }
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219d28;
      PenguinV_Image::ImageTemplate<float>::clear(&local_58);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219d28;
      PenguinV_Image::ImageTemplate<float>::clear(&local_80);
      uVar6 = uVar6 + 1;
      uVar1 = Test_Helper::runCount();
      bVar7 = uVar6 >= uVar1;
    } while (uVar6 < uVar1);
  }
  return bVar7;
}

Assistant:

bool _AssignmentOperator()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            PenguinV_Image::ImageTemplate < _Type > image( width, height, colorCount, alignment );
            image.fill( static_cast<_Type>( Unit_Test::randomValue<uint8_t>( 256u ) ) );

            PenguinV_Image::ImageTemplate < _Type > image_copy;

            image_copy = image;

            if( !Unit_Test::equalSize( image, image_copy ) || !Unit_Test::equalData( image, image_copy ) )
                return false;
        }

        return true;
    }